

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retFlow.c
# Opt level: O0

int Abc_NtkMaxFlowVerifyCut_rec(Abc_Obj_t *pObj,int fForward)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNext;
  int fForward_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    if (fForward == 0) {
      iVar1 = Abc_ObjIsCi(pObj);
      if (iVar1 != 0) {
        return 0;
      }
      for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_2c);
        iVar1 = Abc_NtkMaxFlowVerifyCut_rec(pAVar2,0);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
    else {
      iVar1 = Abc_ObjIsCo(pObj);
      if (iVar1 != 0) {
        return 0;
      }
      for (local_2c = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_2c < iVar1; local_2c = local_2c + 1)
      {
        pAVar2 = Abc_ObjFanout(pObj,local_2c);
        iVar1 = Abc_NtkMaxFlowVerifyCut_rec(pAVar2,fForward);
        if (iVar1 == 0) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

int Abc_NtkMaxFlowVerifyCut_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 1;
    Abc_NodeSetTravIdCurrent(pObj);
    // visit the node
    if ( fForward )
    {
        if ( Abc_ObjIsCo(pObj) )
            return 0;
        // explore the fanouts
        Abc_ObjForEachFanout( pObj, pNext, i )
            if ( !Abc_NtkMaxFlowVerifyCut_rec(pNext, fForward) )
                return 0;
    }
    else
    {
        if ( Abc_ObjIsCi(pObj) )
            return 0;
        // explore the fanins
        Abc_ObjForEachFanin( pObj, pNext, i )
            if ( !Abc_NtkMaxFlowVerifyCut_rec(pNext, fForward) )
                return 0;
    }
    return 1;
}